

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimerQueue.cpp
# Opt level: O0

void __thiscall Liby::TimerQueue::insert(TimerQueue *this,shared_ptr<Liby::Timer> *timer)

{
  bool bVar1;
  element_type *this_00;
  Timestamp *timeout;
  undefined1 local_60 [8];
  WeakTimerHolder weakTimerHolder;
  shared_ptr<Liby::Timer> *timer_local;
  TimerQueue *this_local;
  
  weakTimerHolder.weakTimerPtr_.super___weak_ptr<Liby::Timer,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)timer;
  WeakTimerHolder::WeakTimerHolder((WeakTimerHolder *)local_60,timer);
  bVar1 = BinaryHeap<Liby::WeakTimerHolder>::empty(&this->queue_);
  if (bVar1) {
    this_00 = std::__shared_ptr_access<Liby::Timer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<Liby::Timer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)weakTimerHolder.weakTimerPtr_.
                            super___weak_ptr<Liby::Timer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                            _M_pi);
    timeout = Timer::timeout(this_00);
    updateTimerfd(this,timeout);
  }
  BinaryHeap<Liby::WeakTimerHolder>::insert(&this->queue_,(const_reference_type)local_60);
  WeakTimerHolder::~WeakTimerHolder((WeakTimerHolder *)local_60);
  return;
}

Assistant:

void TimerQueue::insert(const std::shared_ptr<Timer> &timer) {
    WeakTimerHolder weakTimerHolder(timer);
    if (queue_.empty()) {
        updateTimerfd(timer->timeout());
    }
    queue_.insert(weakTimerHolder);
}